

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filenames.c
# Opt level: O0

void test_filename(char *prefix,int dlen,int flen)

{
  int iVar1;
  mode_t mVar2;
  size_t sVar3;
  char *pcVar4;
  int local_2358;
  int local_2354;
  int i;
  int separator;
  size_t used;
  archive *a;
  archive_entry *ae;
  char dirname [400];
  char filename [400];
  char buff [8192];
  int flen_local;
  int dlen_local;
  char *prefix_local;
  
  local_2354 = 0;
  local_2358 = 0;
  if (prefix != (char *)0x0) {
    strcpy(dirname + 0x188,prefix);
    sVar3 = strlen(prefix);
    local_2358 = (int)sVar3;
  }
  if (0 < dlen) {
    for (; local_2358 < dlen; local_2358 = local_2358 + 1) {
      dirname[(long)local_2358 + 0x188] = 'a';
    }
    dirname[(long)local_2358 + 0x188] = '/';
    local_2354 = 1;
    local_2358 = local_2358 + 1;
  }
  for (; local_2358 < dlen + flen + local_2354; local_2358 = local_2358 + 1) {
    dirname[(long)local_2358 + 0x188] = 'b';
  }
  dirname[(long)local_2358 + 0x188] = '\0';
  strcpy((char *)&ae,dirname + 0x188);
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'<',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_ustar((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'=',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",(void *)used);
  iVar1 = archive_write_add_filter_none((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'>',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",(void *)used);
  iVar1 = archive_write_set_bytes_per_block((archive *)used,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'?',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a,0)",
                   (void *)used);
  iVar1 = archive_write_open_memory((archive *)used,filename + 0x188,0x2000,(size_t *)&i);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'@',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'E',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,dirname + 0x188);
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  if (flen < 0x65) {
    iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'L',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  }
  else {
    iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'J',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                        (void *)used);
  }
  archive_entry_free((archive_entry *)a);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'S',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,(char *)&ae);
  archive_entry_set_mode((archive_entry *)a,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  if (flen < 100) {
    iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'Z',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  }
  else {
    iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'X',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                        (void *)used);
  }
  archive_entry_free((archive_entry *)a);
  strcat((char *)&ae,"/");
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'd',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,(char *)&ae);
  archive_entry_set_mode((archive_entry *)a,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  if (flen < 100) {
    iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'k',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)used);
  }
  else {
    iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'i',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                        (void *)used);
  }
  archive_entry_free((archive_entry *)a);
  iVar1 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
  iVar1 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'v',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'w',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",(void *)used);
  iVar1 = archive_read_support_filter_all((archive *)used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'x',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",(void *)used);
  iVar1 = archive_read_open_memory((archive *)used,filename + 0x188,_i);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'y',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, used)",
                   (void *)used);
  if (flen < 0x65) {
    iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'}',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",(void *)used);
    failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x7f',dirname + 0x188,"filename",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
               L'\0');
    mVar2 = archive_entry_mode((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'\x80',0x81ed,"(S_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
  }
  if (flen < 100) {
    iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x8b',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",
                     (void *)used);
    mVar2 = archive_entry_mode((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x8c',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x8e',(char *)&ae,"dirname",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
    ;
    iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x92',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",
                     (void *)used);
    mVar2 = archive_entry_mode((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'\x93',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x94',(char *)&ae,"dirname",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
    ;
  }
  failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d",
          (ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x99',1,"1",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  iVar1 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)used);
  iVar1 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_filename(const char *prefix, int dlen, int flen)
{
	char buff[8192];
	char filename[400];
	char dirname[400];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int separator = 0;
	int i = 0;

	if (prefix != NULL) {
		strcpy(filename, prefix);
		i = (int)strlen(prefix);
	}
	if (dlen > 0) {
		for (; i < dlen; i++)
			filename[i] = 'a';
		filename[i++] = '/';
		separator = 1;
	}
	for (; i < dlen + flen + separator; i++)
		filename[i] = 'b';
	filename[i] = '\0';

	strcpy(dirname, filename);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a,0));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, filename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen > 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/*
	 * Write a dir to it (without trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen >= 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/* Tar adds a '/' to directory names. */
	strcat(dirname, "/");

	/*
	 * Write a dir to it (with trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen >= 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	if (flen <= 100) {
		/* Read the file and check the filename. */
		assertA(0 == archive_read_next_header(a, &ae));
		failure("dlen=%d, flen=%d", dlen, flen);
		assertEqualString(filename, archive_entry_pathname(ae));
		assertEqualInt((S_IFREG | 0755), archive_entry_mode(ae));
	}

	/*
	 * Read the two dirs and check the names.
	 *
	 * Both dirs should read back with the same name, since
	 * tar should add a trailing '/' to any dir that doesn't
	 * already have one.
	 */
	if (flen <= 99) {
		assertA(0 == archive_read_next_header(a, &ae));
		assert((S_IFDIR | 0755) == archive_entry_mode(ae));
		failure("dlen=%d, flen=%d", dlen, flen);
		assertEqualString(dirname, archive_entry_pathname(ae));
	}

	if (flen <= 99) {
		assertA(0 == archive_read_next_header(a, &ae));
		assert((S_IFDIR | 0755) == archive_entry_mode(ae));
		assertEqualString(dirname, archive_entry_pathname(ae));
	}

	/* Verify the end of the archive. */
	failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d", dlen, flen);
	assertEqualInt(1, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}